

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_CDResume(SDL12_CD *cdrom)

{
  SDL12_CD *pSVar1;
  SDL12_CD *cdrom_local;
  
  pSVar1 = ValidCDDevice(cdrom);
  if (pSVar1 == (SDL12_CD *)0x0) {
    cdrom_local._4_4_ = -1;
  }
  else if (pSVar1->status == SDL12_CD_TRAYEMPTY) {
    cdrom_local._4_4_ = (*SDL20_SetError)("Tray empty");
  }
  else {
    (*SDL20_LockAudio)();
    if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
      if (audio_cbdata->cdrom_status == SDL12_CD_PAUSED) {
        audio_cbdata->cdrom_status = SDL12_CD_PLAYING;
      }
      pSVar1->status = audio_cbdata->cdrom_status;
    }
    (*SDL20_UnlockAudio)();
    cdrom_local._4_4_ = 0;
  }
  return cdrom_local._4_4_;
}

Assistant:

SDLCALL
SDL_CDResume(SDL12_CD *cdrom)
{
    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        return SDL20_SetError("Tray empty");
    }

    SDL20_LockAudio();
    if (audio_cbdata) {
        if (audio_cbdata->cdrom_status == SDL12_CD_PAUSED) {
            audio_cbdata->cdrom_status = SDL12_CD_PLAYING;
        }
        cdrom->status = audio_cbdata->cdrom_status;
    }
    SDL20_UnlockAudio();
    return 0;
}